

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_free(void *p)

{
  int N;
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (sqlite3Config.bMemstat == 0) {
      (*sqlite3Config.m.xFree)(in_RDI);
    }
    else {
      sqlite3_mutex_enter((sqlite3_mutex *)0x133387);
      N = sqlite3MallocSize((void *)0x133390);
      sqlite3StatusDown(0,N);
      sqlite3StatusDown(9,1);
      (*sqlite3Config.m.xFree)(in_RDI);
      sqlite3_mutex_leave((sqlite3_mutex *)0x1333c1);
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_free(void *p){
  if( p==0 ) return;  /* IMP: R-49053-54554 */
  assert( sqlite3MemdebugHasType(p, MEMTYPE_HEAP) );
  assert( sqlite3MemdebugNoType(p, (u8)~MEMTYPE_HEAP) );
  if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusDown(SQLITE_STATUS_MEMORY_USED, sqlite3MallocSize(p));
    sqlite3StatusDown(SQLITE_STATUS_MALLOC_COUNT, 1);
    sqlite3GlobalConfig.m.xFree(p);
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    sqlite3GlobalConfig.m.xFree(p);
  }
}